

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.c
# Opt level: O0

LispPTR * N_OP_bind(LispPTR *stack_pointer,LispPTR tos,uint byte1,uint byte2)

{
  DLword *pDVar1;
  uint uVar2;
  uint local_34;
  DLword *pDStack_30;
  uint i;
  LispPTR *ppvar;
  uint n2;
  uint n1;
  uint byte2_local;
  uint byte1_local;
  LispPTR tos_local;
  LispPTR *stack_pointer_local;
  
  uVar2 = byte1 & 0xf;
  pDStack_30 = MachineState.pvar + (ulong)byte2 * 2 + 2;
  for (local_34 = 0; local_34 < byte1 >> 4; local_34 = local_34 + 1) {
    pDStack_30[-2] = 0;
    pDStack_30[-1] = 0;
    pDStack_30 = pDStack_30 + -2;
  }
  if (uVar2 == 0) {
    _byte1_local = stack_pointer + 1;
    *stack_pointer = tos;
  }
  else {
    *(LispPTR *)(pDStack_30 + -2) = tos;
    _byte1_local = stack_pointer;
    pDVar1 = pDStack_30;
    for (local_34 = 1; pDStack_30 = pDVar1 + -2, local_34 < uVar2; local_34 = local_34 + 1) {
      *(LispPTR *)(pDVar1 + -4) = _byte1_local[-1];
      _byte1_local = _byte1_local + -1;
      pDVar1 = pDStack_30;
    }
  }
  *_byte1_local = ((byte1 >> 4) + uVar2 ^ 0xffffffff) << 0x10 | byte2 << 1;
  return _byte1_local;
}

Assistant:

LispPTR *N_OP_bind(LispPTR *stack_pointer, LispPTR tos, unsigned byte1, unsigned byte2) {
  unsigned n1;         /* # slots to bind to NIL (0, 0) */
  unsigned n2;         /* # slots to bind to value in stack */
  LispPTR *ppvar; /* pointer to argued slot in Pvar area */
  unsigned i;          /* temporary for control */

#ifdef TRACE
  printPC();
  printf("TRACE: N_OP_bind()\n");
#endif

  n1 = byte1 >> 4;
  n2 = byte1 & 0xf;
  ppvar = (LispPTR *)PVar + 1 + byte2;

  for (i = 0; i < n1; i++) { *--ppvar = NIL_PTR; }

  if (n2 == 0) {
    *stack_pointer++ = tos; /* push TopOfStack to Evaluation stack */
  } else {
    *--ppvar = tos; /* bind to TopOfStack */
    for (i = 1; i < n2; i++) { *--ppvar = *(--stack_pointer); }
  }

  i = ~(n1 + n2); /* x: 1's complement of number of bind slots */
  *stack_pointer = (i << 16) | (byte2 << 1);
  return (stack_pointer);
}